

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

bool isFatalCountDown(char *varname,QBasicAtomicInt *n)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  bool local_39;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (n->_q_value).super___atomic_base<int>._M_i;
  if (iVar1 == 0) {
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    qgetenv(&local_38,varname);
    if ((undefined1 *)local_38.d.size == (undefined1 *)0x0) {
      iVar2 = 0;
    }
    else {
      local_39 = true;
      iVar1 = QByteArray::toInt(&local_38,&local_39,0);
      iVar2 = 1;
      if (local_39 != false) {
        iVar2 = iVar1;
      }
      if (iVar1 < 0) {
        iVar2 = 1;
      }
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (iVar2 == 1) {
      bVar3 = true;
      goto LAB_00213572;
    }
    if (iVar2 == 0) {
      (n->_q_value).super___atomic_base<int>._M_i = 1;
      bVar3 = false;
      goto LAB_00213572;
    }
    bVar3 = false;
    LOCK();
    iVar1 = (n->_q_value).super___atomic_base<int>._M_i;
    bVar4 = iVar1 == 0;
    if (bVar4) {
      (n->_q_value).super___atomic_base<int>._M_i = iVar2;
      iVar1 = 0;
    }
    UNLOCK();
    if (bVar4) goto LAB_00213572;
  }
  do {
    if (iVar1 < 3) break;
    LOCK();
    iVar2 = (n->_q_value).super___atomic_base<int>._M_i;
    bVar3 = iVar1 == iVar2;
    if (bVar3) {
      (n->_q_value).super___atomic_base<int>._M_i = iVar1 + -1;
      iVar2 = iVar1;
    }
    iVar1 = iVar2;
    UNLOCK();
  } while (!bVar3);
  bVar3 = iVar1 == 2;
LAB_00213572:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool isFatalCountDown(const char *varname, QBasicAtomicInt &n)
{
    static const int Uninitialized = 0;
    static const int NeverFatal = 1;
    static const int ImmediatelyFatal = 2;

    int v = n.loadRelaxed();
    if (v == Uninitialized) {
        // first, initialize from the environment
        // note that the atomic stores the env.var value plus 1, so adjust
        const int env = checked_var_value(varname) + 1;
        if (env == NeverFatal) {
            // not fatal, now or in the future, so use a fast path
            n.storeRelaxed(NeverFatal);
            return false;
        } else if (env == ImmediatelyFatal) {
            return true;
        } else if (n.testAndSetRelaxed(Uninitialized, env - 1, v)) {
            return false;       // not yet fatal, but decrement
        } else {
            // some other thread initialized before we did
        }
    }

    while (v > ImmediatelyFatal && !n.testAndSetRelaxed(v, v - 1, v))
        qYieldCpu();

    // We exited the loop, so either v already was ImmediatelyFatal or we
    // succeeded to set n from v to v-1.
    return v == ImmediatelyFatal;
}